

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
::IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>::IteratorImpl
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_> *this,
          ParamGeneratorInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
          *base,tuple<testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                *generators,bool is_end)

{
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  *local_90;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ParamGenerator<unsigned_int> local_48;
  ParamGenerator<unsigned_short> local_30;
  tuple<testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  *ptStack_20;
  bool is_end_local;
  tuple<testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  *generators_local;
  ParamGeneratorInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  *base_local;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_> *this_local;
  
  local_30.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = is_end;
  ptStack_20 = generators;
  generators_local =
       (tuple<testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
        *)base;
  base_local = (ParamGeneratorInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                *)this;
  ParamIteratorInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  ::ParamIteratorInterface
            (&this->
              super_ParamIteratorInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
            );
  (this->
  super_ParamIteratorInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_00645e50;
  this->base_ = (ParamGeneratorInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                 *)generators_local;
  std::
  get<0ul,testing::internal::ParamGenerator<unsigned_short>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>>
            (ptStack_20);
  ParamGenerator<unsigned_short>::begin(&local_30);
  std::
  get<1ul,testing::internal::ParamGenerator<unsigned_short>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>>
            (ptStack_20);
  ParamGenerator<unsigned_int>::begin(&local_48);
  std::
  get<2ul,testing::internal::ParamGenerator<unsigned_short>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>>
            (ptStack_20);
  ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>::begin
            ((ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode> *)
             (local_58 + 8));
  std::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  ::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_true,_true>
            (&this->begin_,(ParamIterator<unsigned_short> *)&local_30,
             (ParamIterator<unsigned_int> *)&local_48,
             (ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode> *)
             (local_58 + 8));
  ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>::~ParamIterator
            ((ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode> *)
             (local_58 + 8));
  ParamIterator<unsigned_int>::~ParamIterator((ParamIterator<unsigned_int> *)&local_48);
  ParamIterator<unsigned_short>::~ParamIterator((ParamIterator<unsigned_short> *)&local_30);
  std::
  get<0ul,testing::internal::ParamGenerator<unsigned_short>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>>
            (ptStack_20);
  ParamGenerator<unsigned_short>::end((ParamGenerator<unsigned_short> *)local_58);
  std::
  get<1ul,testing::internal::ParamGenerator<unsigned_short>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>>
            (ptStack_20);
  ParamGenerator<unsigned_int>::end((ParamGenerator<unsigned_int> *)(local_68 + 8));
  std::
  get<2ul,testing::internal::ParamGenerator<unsigned_short>,testing::internal::ParamGenerator<unsigned_int>,testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>>
            (ptStack_20);
  ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>::end
            ((ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode> *)
             local_68);
  std::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  ::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_true,_true>
            (&this->end_,(ParamIterator<unsigned_short> *)local_58,
             (ParamIterator<unsigned_int> *)(local_68 + 8),
             (ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode> *)
             local_68);
  ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>::~ParamIterator
            ((ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode> *)
             local_68);
  ParamIterator<unsigned_int>::~ParamIterator((ParamIterator<unsigned_int> *)(local_68 + 8));
  ParamIterator<unsigned_short>::~ParamIterator((ParamIterator<unsigned_short> *)local_58);
  if ((local_30.impl_.
       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._7_1_ & 1) == 0) {
    local_90 = &this->begin_;
  }
  else {
    local_90 = &this->end_;
  }
  std::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  ::tuple(&this->current_,local_90);
  std::
  shared_ptr<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  ::shared_ptr(&this->current_value_);
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }